

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

void __thiscall QPDF::warn(QPDF *this,QPDFExc *e)

{
  pointer pMVar1;
  size_type sVar2;
  element_type *peVar3;
  element_type *this_00;
  Pipeline *pPVar4;
  reference pvVar5;
  char *cstr;
  shared_ptr<Pipeline> local_60 [2];
  allocator<char> local_39;
  string local_38;
  QPDFExc *local_18;
  QPDFExc *e_local;
  QPDF *this_local;
  
  local_18 = e;
  e_local = (QPDFExc *)this;
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  if (pMVar1->max_warnings != 0) {
    pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    sVar2 = std::vector<QPDFExc,_std::allocator<QPDFExc>_>::size(&pMVar1->warnings);
    pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    if (pMVar1->max_warnings <= sVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Too many warnings - file is too badly damaged",&local_39);
      stopOnError(this,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator(&local_39);
    }
  }
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  std::vector<QPDFExc,_std::allocator<QPDFExc>_>::push_back(&pMVar1->warnings,local_18);
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  if ((pMVar1->suppress_warnings & 1U) == 0) {
    pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar3 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )pMVar1);
    QPDFLogger::getWarn((QPDFLogger *)local_60,SUB81(peVar3,0));
    this_00 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_60);
    pPVar4 = Pipeline::operator<<(this_00,"WARNING: ");
    pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    pvVar5 = std::vector<QPDFExc,_std::allocator<QPDFExc>_>::back(&pMVar1->warnings);
    cstr = (char *)(**(code **)(*(long *)pvVar5 + 0x10))();
    pPVar4 = Pipeline::operator<<(pPVar4,cstr);
    Pipeline::operator<<(pPVar4,"\n");
    std::shared_ptr<Pipeline>::~shared_ptr(local_60);
  }
  return;
}

Assistant:

void
QPDF::warn(QPDFExc const& e)
{
    if (m->max_warnings > 0 && m->warnings.size() >= m->max_warnings) {
        stopOnError("Too many warnings - file is too badly damaged");
    }
    m->warnings.push_back(e);
    if (!m->suppress_warnings) {
        *m->log->getWarn() << "WARNING: " << m->warnings.back().what() << "\n";
    }
}